

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZMatTransientSingleSpace.h
# Opt level: O2

void __thiscall
TPZMatTransientSingleSpace<TPZLagrangeMultiplier<double>>::ContributeInterface
          (TPZMatTransientSingleSpace<TPZLagrangeMultiplier<double>> *this)

{
  TPZMaterialDataT<double> *in_RCX;
  TPZMaterialDataT<double> *in_RDX;
  TPZMaterialDataT<double> *in_RSI;
  TPZFMatrix<double> *in_R8;
  TPZFMatrix<double> *in_R9;
  REAL in_XMM0_Qa;
  
  TPZMatTransientSingleSpace<TPZLagrangeMultiplier<double>_>::ContributeInterface
            ((TPZMatTransientSingleSpace<TPZLagrangeMultiplier<double>_> *)(this + -0x48),in_RSI,
             in_RDX,in_RCX,in_XMM0_Qa,in_R8,in_R9);
  return;
}

Assistant:

void TPZMatTransientSingleSpace< TBASEMAT >::ContributeInterface(
    const TPZMaterialDataT<STATE> &data,
    const TPZMaterialDataT<STATE> &dataleft,
    const TPZMaterialDataT<STATE> &dataright,
    REAL weight,
    TPZFMatrix<STATE> &ek,
    TPZFMatrix<STATE> &ef)
{
	
	// Mostly for implicit
	if (this->fStep == ECurrent){
		TBASEMAT::ContributeInterface(data,dataleft,dataright, weight, ek, ef);
		return;
	}
	
	if (this->fStep == ELast){
		return;
	}
	
	// Mostly for explicit
	if (this->fStep == EMassMatrix){
		return;
	}
	if (this->fStep == EFluxOnly){ //Calcula ef = F-ku
		TBASEMAT::ContributeInterface(data,dataleft,dataright, weight, ek, ef);
		return;
	}
	
	
	PZError << "ERROR! " << __PRETTY_FUNCTION__ << " at LINE " << __LINE__ << std::endl;
	
}